

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O3

BaseState<true> * __thiscall
ArrayState<true>::StartObject(ArrayState<true> *this,Context<true> *ctx)

{
  pointer pNVar1;
  char *ns;
  
  pNVar1 = (ctx->namespace_path).
           super__Vector_base<Namespace<true>,_std::allocator<Namespace<true>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pNVar1 == (ctx->namespace_path).
                super__Vector_base<Namespace<true>,_std::allocator<Namespace<true>_>_>._M_impl.
                super__Vector_impl_data._M_start) {
    ns = " ";
  }
  else {
    ns = pNVar1[-1].name;
  }
  Context<true>::PushNamespace(ctx,ns,&this->super_BaseState<true>);
  return &(ctx->default_state).super_BaseState<true>;
}

Assistant:

BaseState<audit>* StartObject(Context<audit>& ctx)
  {
    // parse properties
    ctx.PushNamespace(ctx.namespace_path.size() > 0 ? ctx.CurrentNamespace().name : " ", this);

    return &ctx.default_state;
  }